

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O2

optimistic_lock *
unodb::optimistic_lock::write_guard::try_lock_upgrade(read_critical_section *critical_section)

{
  bool bVar1;
  optimistic_lock *poVar2;
  
  bVar1 = try_upgrade_to_write_lock
                    (critical_section->lock,(version_type)(critical_section->version).version);
  if (bVar1) {
    poVar2 = critical_section->lock;
  }
  else {
    poVar2 = (optimistic_lock *)0x0;
  }
  critical_section->lock = (optimistic_lock *)0x0;
  return poVar2;
}

Assistant:

[[nodiscard]] static optimistic_lock *try_lock_upgrade(
        read_critical_section &&critical_section) noexcept {
      const auto upgrade_success =
          critical_section.lock->try_upgrade_to_write_lock(
              critical_section.version);
      auto *const result = UNODB_DETAIL_LIKELY(upgrade_success)
                               ? critical_section.lock
                               : nullptr;
#ifndef NDEBUG
      critical_section.lock = nullptr;
#endif
      return result;
    }